

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase90::run(TestCase90 *this)

{
  Array<char> chars;
  
  chars.ptr = _::HeapArrayDisposer::allocate<char>(0x20);
  chars.size_ = 0x20;
  chars.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  chars.ptr[0] = '\f';
  chars.ptr[1] = '\"';
  Array<char>::~Array(&chars);
  chars.ptr = _::HeapArrayDisposer::allocate<char>(0x20);
  chars.size_ = 0x20;
  chars.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  Array<char>::~Array(&chars);
  return;
}

Assistant:

TEST(Array, TrivialConstructor) {
//  char* ptr;
  {
    Array<char> chars = heapArray<char>(32);
//    ptr = chars.begin();
    chars[0] = 12;
    chars[1] = 34;
  }

  {
    Array<char> chars = heapArray<char>(32);

    // TODO(test):  The following doesn't work in opt mode -- I guess some allocators zero the
    //   memory?  Is there some other way we can test this?  Maybe override malloc()?
//    // Somewhat hacky:  We can't guarantee that the new array is allocated in the same place, but
//    // any reasonable allocator is highly likely to do so.  If it does, then we expect that the
//    // memory has not been initialized.
//    if (chars.begin() == ptr) {
//      EXPECT_NE(chars[0], 0);
//      EXPECT_NE(chars[1], 0);
//    }
  }
}